

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double CEDate::GregorianVect2JD(vector<double,_std::allocator<double>_> *gregorian)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  ostream *poVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar5;
  int err_code;
  double mjd;
  double mjd_factor;
  double local_20;
  double local_18 [3];
  
  local_18[0] = 0.0;
  local_20 = 0.0;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  dVar5 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  dVar1 = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  iVar2 = iauCal2jd((int)dVar5,(int)dVar1,(int)*pvVar3,local_18,&local_20);
  if (iVar2 != 0) {
    std::operator<<((ostream *)&std::cerr,"[WARNING] CEDate::GregorianVect2JD() :: Bad ");
    if (iVar2 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"year (");
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
      poVar4 = std::operator<<(poVar4,"). Make sure the year is larger than -4800.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return 0.0;
    }
    if (iVar2 == -2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"month (");
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
      poVar4 = std::operator<<(poVar4,"). Make sure this number is in the range 1 -> 12.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      return 0.0;
    }
    if (iVar2 == -3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"day (");
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  dVar5 = local_18[0] + local_20;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
  return dVar5 + *pvVar3;
}

Assistant:

double CEDate::GregorianVect2JD(std::vector<double> gregorian)
{
    // The following stores the two values needed to get the julian date
    double mjd_factor(0.0);
    double mjd(0.0);
    
    // Now use the sofa function for converting to julian date
    int err_code = iauCal2jd(int(gregorian[0]), int(gregorian[1]),
                             int(gregorian[2]), &mjd_factor, &mjd) ;
    if (err_code) {
        std::cerr << "[WARNING] CEDate::GregorianVect2JD() :: Bad ";
        if (err_code == -1) {
            std::cerr << "year (" << gregorian[0] << "). Make sure the year is larger than -4800." << std::endl ;
            return 0.0 ;
        } else if (err_code == -2) {
            std::cerr << "month (" << gregorian[1] << "). Make sure this number is in the range 1 -> 12." << std::endl ;
            return 0.0 ;
        } else if (err_code == -3) {
            std::cerr << "day (" << gregorian[2] << ")" << std::endl ;
            // Note that in this case, a julian date was still calculated
            // so we can go ahead and return it
        }
    }
    
    // Return the sum of the two filled date values which represents
    // the Julian date
    return mjd_factor + mjd + gregorian[3] ;
}